

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase367::run(TestCase367 *this)

{
  Builder builder_00;
  DebugExpression<bool> _kjCondition;
  Array<capnp::word> serialized;
  TestOutputStream output;
  Builder local_128;
  TestMessageBuilder builder;
  
  TestMessageBuilder::TestMessageBuilder(&builder,10);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_128,(MessageBuilder *)&builder);
  builder_00._builder.capTable = local_128._builder.capTable;
  builder_00._builder.segment = local_128._builder.segment;
  builder_00._builder.data = local_128._builder.data;
  builder_00._builder.pointers = local_128._builder.pointers;
  builder_00._builder.dataSize = local_128._builder.dataSize;
  builder_00._builder.pointerCount = local_128._builder.pointerCount;
  builder_00._builder._38_2_ = local_128._builder._38_2_;
  initTestMessage(builder_00);
  messageToFlatArray(&serialized,(MessageBuilder *)&builder);
  output.data._M_dataplus._M_p = (pointer)&output.data.field_2;
  output.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__TestOutputStream_0035ad58;
  output.data._M_string_length = 0;
  output.data.field_2._M_local_buf[0] = '\0';
  writeMessage(&output.super_OutputStream,(MessageBuilder *)&builder);
  _kjCondition.value =
       TestOutputStream::dataEquals(&output,(ArrayPtr<const_capnp::word>)serialized._0_16_);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.value) {
    kj::_::Debug::log<char_const(&)[55],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-test.c++"
               ,0x178,ERROR,
               "\"failed: expected \" \"output.dataEquals(serialized.asPtr())\", _kjCondition",
               (char (*) [55])"failed: expected output.dataEquals(serialized.asPtr())",&_kjCondition
              );
  }
  TestOutputStream::~TestOutputStream(&output);
  kj::Array<capnp::word>::~Array(&serialized);
  TestMessageBuilder::~TestMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, DynamicList) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56});
  EXPECT_TRUE(root.hasAnyPointerField());

  Orphan<DynamicList> orphan =
      root.getAnyPointerField().disownAs<DynamicList>(Schema::from<List<uint32_t>>());
  EXPECT_FALSE(orphan == nullptr);

  checkList<uint32_t>(orphan.getReader(), {12, 34, 56});
  EXPECT_FALSE(root.hasAnyPointerField());

  root.getAnyPointerField().adopt(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasAnyPointerField());
  checkList(root.asReader().getAnyPointerField().getAs<List<uint32_t>>(), {12u, 34u, 56u});

  Orphan<DynamicList> orphan2 = root.getAnyPointerField().disownAs<List<uint32_t>>();
  EXPECT_FALSE(orphan2 == nullptr);
  checkList<uint32_t>(orphan2.getReader(), {12, 34, 56});
}